

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

ssize_t __thiscall
anon_unknown.dwarf_1b6921c::Impl::send(Impl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  ssize_t sVar2;
  undefined8 extraout_RAX;
  void *__buf_00;
  undefined4 in_register_00000034;
  string local_a8;
  undefined4 local_88;
  anon_class_24_3_590045b7 local_78;
  function<bool_(dap::FieldSerializer_*)> local_60;
  undefined1 local_40 [8];
  Serializer s;
  void *event_local;
  TypeInfo *typeinfo_local;
  Impl *this_local;
  
  event_local = (void *)CONCAT44(in_register_00000034,__fd);
  s._16_8_ = __buf;
  typeinfo_local = (TypeInfo *)this;
  dap::json::JsonCppSerializer::JsonCppSerializer((JsonCppSerializer *)local_40);
  local_78.typeinfo = (TypeInfo **)&event_local;
  local_78.event = (void **)&s.ownsJson;
  local_78.this = this;
  std::function<bool(dap::FieldSerializer*)>::
  function<(anonymous_namespace)::Impl::send(dap::TypeInfo_const*,void_const*)::_lambda(dap::FieldSerializer*)_1_,void>
            ((function<bool(dap::FieldSerializer*)> *)&local_60,&local_78);
  bVar1 = dap::json::JsonCppSerializer::object((JsonCppSerializer *)local_40,&local_60);
  std::function<bool_(dap::FieldSerializer_*)>::~function(&local_60);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    dap::json::JsonCppSerializer::dump_abi_cxx11_(&local_a8,(JsonCppSerializer *)local_40);
    sVar2 = send(this,(int)&local_a8,__buf_00,__n,__flags);
    this_local._7_1_ = (byte)sVar2 & 1;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    this_local._7_1_ = 0;
  }
  local_88 = 1;
  dap::json::JsonCppSerializer::~JsonCppSerializer((JsonCppSerializer *)local_40);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

bool send(const dap::TypeInfo* typeinfo, const void* event) override {
    dap::json::Serializer s;
    if (!s.object([&](dap::FieldSerializer* fs) {
          return fs->field("seq", dap::integer(nextSeq++)) &&
                 fs->field("type", "event") &&
                 fs->field("event", typeinfo->name()) &&
                 fs->field("body", [&](dap::Serializer* s) {
                   return typeinfo->serialize(s, event);
                 });
        })) {
      return false;
    }
    return send(s.dump());
  }